

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setCompleteGroupDotNameFilter_Test::testBody
          (TEST_CommandLineArguments_setCompleteGroupDotNameFilter_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TestFilter *pTVar4;
  TestFilter *pTVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 local_188 [48];
  undefined1 local_158 [48];
  TestFilter local_128;
  TestFilter local_108;
  undefined1 local_e8 [48];
  undefined1 local_b8 [48];
  TestFilter local_88;
  TestFilter local_58;
  char *local_38;
  char *argv [3];
  int argc;
  TEST_CommandLineArguments_setCompleteGroupDotNameFilter_Test *this_local;
  
  local_38 = "tests.exe";
  argv[0] = "-t";
  argv[1] = "group.name";
  pUVar2 = UtestShell::getCurrent();
  bVar1 = TEST_GROUP_CppUTestGroupCommandLineArguments::newArgumentParser
                    (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments,3,&local_38);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","newArgumentParser(argc, argv)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
             ,0xd6,pTVar3);
  TestFilter::TestFilter(&local_58,"group");
  pTVar4 = CommandLineArguments::getGroupFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=(&local_58,pTVar4);
  TestFilter::~TestFilter(&local_58);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    pTVar5 = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,pTVar5);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xd7);
    }
    TestFilter::TestFilter(&local_88,"group");
    TestFilter::TestFilter((TestFilter *)(local_b8 + 0x10),"group");
    bVar1 = TestFilter::operator!=(&local_88,(TestFilter *)(local_b8 + 0x10));
    TestFilter::~TestFilter((TestFilter *)(local_b8 + 0x10));
    TestFilter::~TestFilter(&local_88);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xd7);
    }
    pUVar2 = UtestShell::getCurrent();
    TestFilter::TestFilter((TestFilter *)(local_e8 + 0x10),"group");
    StringFrom((TestFilter *)local_b8);
    pcVar6 = SimpleString::asCharString((SimpleString *)local_b8);
    CommandLineArguments::getGroupFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)local_e8);
    pcVar7 = SimpleString::asCharString((SimpleString *)local_e8);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xd7,pTVar3);
    SimpleString::~SimpleString((SimpleString *)local_e8);
    SimpleString::~SimpleString((SimpleString *)local_b8);
    TestFilter::~TestFilter((TestFilter *)(local_e8 + 0x10));
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xd7,pTVar3);
  }
  TestFilter::TestFilter(&local_108,"name");
  pTVar4 = CommandLineArguments::getNameFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=(&local_108,pTVar4);
  TestFilter::~TestFilter(&local_108);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getNameFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    pTVar5 = CommandLineArguments::getNameFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,pTVar5);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xd8);
    }
    TestFilter::TestFilter(&local_128,"name");
    TestFilter::TestFilter((TestFilter *)(local_158 + 0x10),"name");
    bVar1 = TestFilter::operator!=(&local_128,(TestFilter *)(local_158 + 0x10));
    TestFilter::~TestFilter((TestFilter *)(local_158 + 0x10));
    TestFilter::~TestFilter(&local_128);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xd8);
    }
    pUVar2 = UtestShell::getCurrent();
    TestFilter::TestFilter((TestFilter *)(local_188 + 0x10),"name");
    StringFrom((TestFilter *)local_158);
    pcVar6 = SimpleString::asCharString((SimpleString *)local_158);
    CommandLineArguments::getNameFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)local_188);
    pcVar7 = SimpleString::asCharString((SimpleString *)local_188);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xd8,pTVar3);
    SimpleString::~SimpleString((SimpleString *)local_188);
    SimpleString::~SimpleString((SimpleString *)local_158);
    TestFilter::~TestFilter((TestFilter *)(local_188 + 0x10));
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xd8,pTVar3);
  }
  return;
}

Assistant:

TEST(CommandLineArguments, setCompleteGroupDotNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-t", "group.name" };
    CHECK(newArgumentParser(argc, argv));
    CHECK_EQUAL(TestFilter("group"), *args->getGroupFilters());
    CHECK_EQUAL(TestFilter("name"), *args->getNameFilters());
}